

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_bbox.cpp
# Opt level: O3

int __thiscall FBoundingBox::BoxOnLineSide(FBoundingBox *this,line_t *ld)

{
  double *pdVar1;
  double y;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = (ld->delta).X;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar5 = (ld->delta).Y;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      y = this->m_Box[0];
      if (0.0 <= dVar6 * dVar5) {
        if ((i_compatflags2 & 8U) == 0) {
          uVar4 = (uint)(1.52587890625e-05 <
                        dVar5 * ((ld->v1->p).X - this->m_Box[2]) + dVar6 * (y - (ld->v1->p).Y));
        }
        else {
          uVar4 = P_VanillaPointOnLineSide(this->m_Box[2],y,ld);
        }
        dVar6 = this->m_Box[1];
        dVar5 = this->m_Box[3];
      }
      else {
        if ((i_compatflags2 & 8U) == 0) {
          uVar4 = (uint)(1.52587890625e-05 <
                        dVar5 * ((ld->v1->p).X - this->m_Box[3]) + dVar6 * (y - (ld->v1->p).Y));
        }
        else {
          uVar4 = P_VanillaPointOnLineSide(this->m_Box[3],y,ld);
        }
        dVar6 = this->m_Box[1];
        dVar5 = this->m_Box[2];
      }
      if ((i_compatflags2 & 8U) == 0) {
        uVar2 = (uint)(1.52587890625e-05 <
                      (ld->delta).Y * ((ld->v1->p).X - dVar5) +
                      (ld->delta).X * (dVar6 - (ld->v1->p).Y));
      }
      else {
        uVar2 = P_VanillaPointOnLineSide(dVar5,dVar6,ld);
      }
      goto LAB_003a06b3;
    }
    dVar5 = (ld->v1->p).Y;
    uVar4 = (uint)(dVar5 < this->m_Box[0]);
    uVar2 = (uint)(dVar5 < this->m_Box[1]);
    if (0.0 <= dVar6) goto LAB_003a06b3;
  }
  else {
    dVar6 = (ld->v1->p).X;
    uVar4 = (uint)(this->m_Box[3] <= dVar6 && dVar6 != this->m_Box[3]);
    uVar2 = (uint)(this->m_Box[2] <= dVar6 && dVar6 != this->m_Box[2]);
    pdVar1 = &(ld->delta).Y;
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) goto LAB_003a06b3;
  }
  uVar4 = uVar4 ^ 1;
  uVar2 = uVar2 ^ 1;
LAB_003a06b3:
  uVar3 = 0xffffffff;
  if (uVar4 == uVar2) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

int FBoundingBox::BoxOnLineSide (const line_t *ld) const
{
	int p1;
	int p2;
		
	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		p1 = m_Box[BOXRIGHT] < ld->v1->fX();
		p2 = m_Box[BOXLEFT] < ld->v1->fX();
		if (ld->Delta().Y < 0)
		{
			p1 ^= 1;
			p2 ^= 1;
		}
	}
	else if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL:
		p1 = m_Box[BOXTOP] > ld->v1->fY();
		p2 = m_Box[BOXBOTTOM] > ld->v1->fY();
		if (ld->Delta().X < 0)
		{
			p1 ^= 1;
			p2 ^= 1;
		}
	}
	else if ((ld->Delta().X * ld->Delta().Y) >= 0)
	{ // ST_POSITIVE:
		p1 = P_PointOnLineSide (m_Box[BOXLEFT], m_Box[BOXTOP], ld);
		p2 = P_PointOnLineSide (m_Box[BOXRIGHT], m_Box[BOXBOTTOM], ld);
	}
	else
	{ // ST_NEGATIVE:
		p1 = P_PointOnLineSide (m_Box[BOXRIGHT], m_Box[BOXTOP], ld);
		p2 = P_PointOnLineSide (m_Box[BOXLEFT], m_Box[BOXBOTTOM], ld);
	}

	return (p1 == p2) ? p1 : -1;
}